

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_setup_sockets
              (rtr_mgr_config *config,rtr_mgr_group *groups,uint groups_len,uint refresh_interval,
              uint expire_interval,uint retry_interval)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  tommy_list_wrapper *ptVar4;
  tommy_node_struct *ptVar5;
  tommy_list ptVar6;
  tommy_node_struct *ptVar7;
  rtr_interval_mode iv_mode;
  long lVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  config->len = groups_len;
  iv_mode = retry_interval;
  ptVar4 = (tommy_list_wrapper *)lrtr_malloc(8);
  config->groups = ptVar4;
  iVar3 = -1;
  if (ptVar4 != (tommy_list_wrapper *)0x0) {
    ptVar4->list = (tommy_list)0x0;
    if (groups_len != 0) {
      lVar8 = 0;
      do {
        ptVar5 = (tommy_node_struct *)lrtr_malloc(0x18);
        if (ptVar5 == (tommy_node_struct *)0x0) {
LAB_00105d47:
          iVar3 = -1;
          goto LAB_00105d4c;
        }
        ptVar5->data = *(void **)((long)&groups->status + lVar8);
        puVar1 = (undefined8 *)((long)&groups->sockets + lVar8);
        ptVar7 = (tommy_node_struct *)puVar1[1];
        ptVar5->next = (tommy_node_struct *)*puVar1;
        ptVar5->prev = ptVar7;
        *(rtr_mgr_status *)&ptVar5->data = RTR_MGR_CLOSED;
        iVar3 = rtr_mgr_init_sockets
                          ((rtr_mgr_group *)ptVar5,config,refresh_interval,expire_interval,
                           retry_interval,iv_mode);
        if (iVar3 != 0) {
LAB_00105d3f:
          lrtr_free(ptVar5);
          goto LAB_00105d47;
        }
        ptVar6 = (tommy_list)lrtr_malloc(0x28);
        if (ptVar6 == (tommy_list)0x0) goto LAB_00105d3f;
        ptVar6[1].next = ptVar5;
        ptVar7 = (tommy_node_struct *)config->groups;
        ptVar5 = ptVar7->next;
        if (ptVar5 == (tommy_node_struct *)0x0) {
          ptVar6->prev = ptVar6;
          ptVar6->next = (tommy_node_struct *)0x0;
        }
        else {
          ptVar6->prev = ptVar5->prev;
          ptVar5->prev = ptVar6;
          ptVar6->next = (tommy_node_struct *)0x0;
          ptVar7 = ptVar6->prev;
        }
        ptVar7->next = ptVar6;
        ptVar6->data = ptVar6;
        lVar8 = lVar8 + 0x18;
      } while ((ulong)groups_len * 0x18 != lVar8);
    }
    tommy_list_sort(&config->groups->list,rtr_mgr_config_cmp_tommy);
    iVar3 = 0;
  }
LAB_00105d4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_setup_sockets(struct rtr_mgr_config *config, struct rtr_mgr_group groups[],
					const unsigned int groups_len, const unsigned int refresh_interval,
					const unsigned int expire_interval, const unsigned int retry_interval)
{
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	struct rtr_mgr_group_node *group_node = NULL;
	struct rtr_mgr_group *cg = NULL;
	/* Copy the groups from the array into linked list config->groups */
	config->len = groups_len;
	config->groups = lrtr_malloc(sizeof(*config->groups));
	if (!config->groups) {
		return RTR_ERROR;
	}

	config->groups->list = NULL;

	for (unsigned int i = 0; i < groups_len; i++) {
		cg = lrtr_malloc(sizeof(struct rtr_mgr_group));
		if (!cg) {
			return RTR_ERROR;
		}

		memcpy(cg, &groups[i], sizeof(struct rtr_mgr_group));

		cg->status = RTR_MGR_CLOSED;
		if (rtr_mgr_init_sockets(cg, config, refresh_interval, expire_interval, retry_interval, iv_mode)) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
		if (!group_node) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node->group = cg;
		tommy_list_insert_tail(&config->groups->list, &group_node->node, group_node);
	}
	/* Our linked list should be sorted already, since the groups array was
	 * sorted. However, for safety reasons we sort again.
	 */
	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	return RTR_SUCCESS;
}